

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O0

DdNode * cuddBddPermuteRecur(DdManager *manager,DdHashTable *table,DdNode *node,int *permut)

{
  int iVar1;
  DdNode *f;
  DdNode *pDVar2;
  DdNode *h;
  DdNode *value;
  ptrint fanout;
  int index;
  DdNode *res;
  DdNode *E;
  DdNode *T;
  DdNode *N;
  int *permut_local;
  DdNode *node_local;
  DdHashTable *table_local;
  DdManager *manager_local;
  
  f = (DdNode *)((ulong)node & 0xfffffffffffffffe);
  manager_local = (DdManager *)node;
  if (f->index != 0x7fffffff) {
    if ((f->ref == 1) || (pDVar2 = cuddHashTableLookup1(table,f), pDVar2 == (DdNode *)0x0)) {
      pDVar2 = cuddBddPermuteRecur(manager,table,(f->type).kids.T,permut);
      if (pDVar2 == (DdNode *)0x0) {
        manager_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
        h = cuddBddPermuteRecur(manager,table,(f->type).kids.E,permut);
        if (h == (DdNode *)0x0) {
          Cudd_IterDerefBdd(manager,pDVar2);
          manager_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) + 1;
          value = cuddBddIteRecur(manager,manager->vars[permut[f->index]],pDVar2,h);
          if (value == (DdNode *)0x0) {
            Cudd_IterDerefBdd(manager,pDVar2);
            Cudd_IterDerefBdd(manager,h);
            manager_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)value & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)value & 0xfffffffffffffffe) + 4) + 1;
            Cudd_IterDerefBdd(manager,pDVar2);
            Cudd_IterDerefBdd(manager,h);
            if ((f->ref == 1) ||
               (iVar1 = cuddHashTableInsert1(table,f,value,(ulong)f->ref - 1), iVar1 != 0)) {
              *(int *)(((ulong)value & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)value & 0xfffffffffffffffe) + 4) + -1;
              manager_local = (DdManager *)((ulong)value ^ (long)(int)(uint)(f != node));
            }
            else {
              Cudd_IterDerefBdd(manager,value);
              manager_local = (DdManager *)0x0;
            }
          }
        }
      }
    }
    else {
      manager_local = (DdManager *)((ulong)pDVar2 ^ (long)(int)(uint)(f != node));
    }
  }
  return &manager_local->sentinel;
}

Assistant:

static DdNode *
cuddBddPermuteRecur(
  DdManager * manager /* DD manager */,
  DdHashTable * table /* computed table */,
  DdNode * node /* BDD to be reordered */,
  int * permut /* permutation array */)
{
    DdNode      *N,*T,*E;
    DdNode      *res;
    int         index;

    statLine(manager);
    N = Cudd_Regular(node);

    /* Check for terminal case of constant node. */
    if (cuddIsConstant(N)) {
        return(node);
    }

    /* If problem already solved, look up answer and return. */
    if (N->ref != 1 && (res = cuddHashTableLookup1(table,N)) != NULL) {
#ifdef DD_DEBUG
        bddPermuteRecurHits++;
#endif
        return(Cudd_NotCond(res,N != node));
    }

    /* Split and recur on children of this node. */
    T = cuddBddPermuteRecur(manager,table,cuddT(N),permut);
    if (T == NULL) return(NULL);
    cuddRef(T);
    E = cuddBddPermuteRecur(manager,table,cuddE(N),permut);
    if (E == NULL) {
        Cudd_IterDerefBdd(manager, T);
        return(NULL);
    }
    cuddRef(E);

    /* Move variable that should be in this position to this position
    ** by retrieving the single var BDD for that variable, and calling
    ** cuddBddIteRecur with the T and E we just created.
    */
    index = permut[N->index];
    res = cuddBddIteRecur(manager,manager->vars[index],T,E);
    if (res == NULL) {
        Cudd_IterDerefBdd(manager, T);
        Cudd_IterDerefBdd(manager, E);
        return(NULL);
    }
    cuddRef(res);
    Cudd_IterDerefBdd(manager, T);
    Cudd_IterDerefBdd(manager, E);

    /* Do not keep the result if the reference count is only 1, since
    ** it will not be visited again.
    */
    if (N->ref != 1) {
        ptrint fanout = (ptrint) N->ref;
        cuddSatDec(fanout);
        if (!cuddHashTableInsert1(table,N,res,fanout)) {
            Cudd_IterDerefBdd(manager, res);
            return(NULL);
        }
    }
    cuddDeref(res);
    return(Cudd_NotCond(res,N != node));

}